

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_raster.cpp
# Opt level: O2

void __thiscall QSpanData::setupMatrix(QSpanData *this,QTransform *matrix,int bilin)

{
  long lVar1;
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  bool bVar5;
  TransformationType TVar6;
  uint uVar7;
  undefined7 extraout_var;
  long lVar8;
  long lVar9;
  qreal *pqVar10;
  qreal *pqVar11;
  QTransform *pQVar12;
  bool bVar13;
  bool bVar14;
  long in_FS_OFFSET;
  byte bVar15;
  ulong uVar16;
  QTransform local_128;
  QTransform inv;
  QTransform delta;
  
  bVar15 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar9 = 10;
  pqVar10 = (qreal *)&DAT_005ed758;
  pqVar11 = (qreal *)&delta;
  for (lVar8 = lVar9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pqVar11 = *pqVar10;
    pqVar10 = pqVar10 + 1;
    pqVar11 = pqVar11 + 1;
  }
  pqVar10 = (qreal *)&DAT_005ed7f8;
  pqVar11 = (qreal *)&delta;
  for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
    *pqVar11 = *pqVar10;
    pqVar10 = pqVar10 + 1;
    pqVar11 = pqVar11 + 1;
  }
  delta._72_2_ = 0xa800;
  QTransform::translate(&delta,1.52587890625e-05,1.52587890625e-05);
  pqVar10 = (qreal *)&DAT_005ed758;
  pQVar12 = &inv;
  for (; lVar9 != 0; lVar9 = lVar9 + -1) {
    pQVar12->m_matrix[0][0] = *pqVar10;
    pqVar10 = pqVar10 + (ulong)bVar15 * -2 + 1;
    pQVar12 = (QTransform *)((long)pQVar12 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  QTransform::operator*(&local_128,&delta,matrix);
  bVar13 = false;
  QTransform::inverted(&inv,&local_128,(bool *)0x0);
  this->m11 = inv.m_matrix[0][0];
  this->m12 = inv.m_matrix[0][1];
  this->m13 = inv.m_matrix[0][2];
  this->m21 = inv.m_matrix[1][0];
  this->m22 = inv.m_matrix[1][1];
  this->m23 = inv.m_matrix[1][2];
  this->m33 = inv.m_matrix[2][2];
  this->dx = inv.m_matrix[2][0];
  this->dy = inv.m_matrix[2][1];
  TVar6 = QTransform::type(&inv);
  this->field_0x89 = (char)TVar6;
  this->bilinear = bilin != 0;
  bVar5 = QTransform::isAffine(&inv);
  bVar14 = false;
  if (bVar5) {
    dVar2 = this->m11 * this->m11 + this->m21 * this->m21;
    dVar3 = this->m12 * this->m12 + this->m22 * this->m22;
    auVar4._8_8_ = -(ulong)(dVar3 < 10000.0);
    auVar4._0_8_ = -(ulong)(dVar2 < 10000.0);
    uVar7 = movmskpd((int)CONCAT71(extraout_var,bVar5),auVar4);
    bVar14 = bVar13;
    if (((((uVar7 & 1) != 0) && ((byte)((byte)uVar7 >> 1) != 0)) && (1.52587890625e-05 < dVar2)) &&
       (1.52587890625e-05 < dVar3)) {
      dVar2 = this->dx;
      uVar16 = -(ulong)(dVar2 < -dVar2);
      if (10000.0 <= (double)(~uVar16 & (ulong)dVar2 | (ulong)-dVar2 & uVar16)) {
        bVar14 = false;
      }
      else {
        dVar2 = this->dy;
        uVar16 = -(ulong)(dVar2 < -dVar2);
        bVar14 = (double)(~uVar16 & (ulong)dVar2 | (ulong)-dVar2 & uVar16) < 10000.0;
      }
    }
  }
  this->field_0x8a = this->field_0x8a & 0xfe | bVar14;
  adjustSpanMethods(this);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSpanData::setupMatrix(const QTransform &matrix, int bilin)
{
    QTransform delta;
    // make sure we round off correctly in qdrawhelper.cpp
    delta.translate(1.0 / 65536, 1.0 / 65536);

    QTransform inv = (delta * matrix).inverted();
    m11 = inv.m11();
    m12 = inv.m12();
    m13 = inv.m13();
    m21 = inv.m21();
    m22 = inv.m22();
    m23 = inv.m23();
    m33 = inv.m33();
    dx = inv.dx();
    dy = inv.dy();
    txop = inv.type();
    bilinear = bilin;

    const bool affine = inv.isAffine();
    const qreal f1 = m11 * m11 + m21 * m21;
    const qreal f2 = m12 * m12 + m22 * m22;
    fast_matrix = affine
        && f1 < 1e4
        && f2 < 1e4
        && f1 > (1.0 / 65536)
        && f2 > (1.0 / 65536)
        && qAbs(dx) < 1e4
        && qAbs(dy) < 1e4;

    adjustSpanMethods();
}